

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlReaderNewMemory(xmlTextReaderPtr reader,char *buffer,int size,char *URL,char *encoding,
                      int options)

{
  int iVar1;
  xmlParserInputBufferPtr input;
  
  if (buffer != (char *)0x0 && reader != (xmlTextReaderPtr)0x0) {
    input = xmlParserInputBufferCreateStatic(buffer,size,XML_CHAR_ENCODING_NONE);
    if (input != (xmlParserInputBufferPtr)0x0) {
      iVar1 = xmlTextReaderSetup(reader,input,URL,encoding,options);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlReaderNewMemory(xmlTextReaderPtr reader, const char *buffer, int size,
                   const char *URL, const char *encoding, int options)
{
    xmlParserInputBufferPtr input;

    if (reader == NULL)
        return (-1);
    if (buffer == NULL)
        return (-1);

    input = xmlParserInputBufferCreateStatic(buffer, size,
                                      XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        return (-1);
    }
    return (xmlTextReaderSetup(reader, input, URL, encoding, options));
}